

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mad.cpp
# Opt level: O1

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::BindMedianAbsoluteDeviationDecimal
          (duckdb *this,ClientContext *context,AggregateFunction *function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  reference this_00;
  pointer pEVar1;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  *arguments_00;
  AggregateFunction *function_00;
  AggregateFunction result;
  undefined **local_148 [21];
  undefined1 local_9e;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  
  this_00 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
            ::operator[](arguments,0);
  pEVar1 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (this_00);
  GetMedianAbsoluteDeviationAggregateFunctionInternal
            ((AggregateFunction *)local_148,(LogicalType *)(pEVar1 + 0x38));
  local_9e = 1;
  AggregateFunction::operator=(function,(AggregateFunction *)local_148);
  local_148[0] = &PTR__AggregateFunction_00897e98;
  if (local_20._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20._M_pi);
  }
  duckdb::BaseScalarFunction::~BaseScalarFunction((BaseScalarFunction *)local_148);
  function_00 = (AggregateFunction *)0x0;
  std::__cxx11::string::_M_replace
            ((ulong)&function->field_0x8,0,*(char **)&function->field_0x10,0x77798b);
  function->order_dependent = NOT_ORDER_DEPENDENT;
  BindMAD((ClientContext *)this,function_00,arguments_00);
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)this;
}

Assistant:

unique_ptr<FunctionData> BindMedianAbsoluteDeviationDecimal(ClientContext &context, AggregateFunction &function,
                                                            vector<unique_ptr<Expression>> &arguments) {
	function = GetMedianAbsoluteDeviationAggregateFunction(arguments[0]->return_type);
	function.name = "mad";
	function.order_dependent = AggregateOrderDependent::NOT_ORDER_DEPENDENT;
	return BindMAD(context, function, arguments);
}